

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractstringserialiser.cpp
# Opt level: O0

QString * AbstractStringSerialiserPrivate::saveImageVariant
                    (QString *__return_storage_ptr__,QImage *imageData)

{
  QByteArrayView QVar1;
  QFlags<QByteArray::Base64Option> local_84;
  QByteArray local_80;
  char *local_68;
  QByteArrayView local_60 [2];
  QBuffer local_40 [8];
  QBuffer buffer;
  undefined1 local_30 [8];
  QByteArray byteArray;
  QImage *imageData_local;
  
  byteArray.d.size = (qsizetype)imageData;
  QByteArray::QByteArray((QByteArray *)local_30);
  QBuffer::QBuffer(local_40,(QByteArray *)local_30,(QObject *)0x0);
  QImage::save((QIODevice *)byteArray.d.size,(char *)local_40,0x1a1818);
  QFlags<QByteArray::Base64Option>::QFlags(&local_84,Base64Encoding);
  QByteArray::toBase64((QFlags_conflict1 *)&local_80);
  local_68 = QByteArray::constData(&local_80);
  QByteArrayView::QByteArrayView<const_char_*,_true>(local_60,&local_68);
  QVar1.m_data = (storage_type *)local_60[0].m_size;
  QVar1.m_size = (qsizetype)__return_storage_ptr__;
  QString::fromLatin1(QVar1);
  QByteArray::~QByteArray(&local_80);
  QBuffer::~QBuffer(local_40);
  QByteArray::~QByteArray((QByteArray *)local_30);
  return __return_storage_ptr__;
}

Assistant:

QString AbstractStringSerialiserPrivate::saveImageVariant(const QImage &imageData)
{
    QByteArray byteArray;
    QBuffer buffer(&byteArray);
    imageData.save(&buffer, "PNG");
    return QString::fromLatin1(byteArray.toBase64().constData());
}